

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

int AdvisorShape(Situation *s)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int *in_RDI;
  int black_penalty_value;
  int red_penalty_value;
  int shape;
  int y;
  int x;
  int adv2;
  int adv1;
  int pos;
  int pc_rook;
  int pc_cannon;
  int local_50;
  int local_4c;
  int local_48;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int in_stack_fffffffffffffff0;
  int local_c;
  
  local_30 = 0;
  local_2c = 0;
  if ((*(char *)((long)in_RDI + 0x115) == '\0') || (*(char *)((long)in_RDI + 0x116) == '\0')) {
    if ((*(char *)((long)in_RDI + 299) != '\0') && ((char)in_RDI[0x4b] != '\0')) {
      local_2c = RedAdvisorLeakage;
    }
  }
  else if ((char)in_RDI[0x45] == -0x39) {
    cVar1 = *(char *)((long)in_RDI + 0x115);
    uVar3 = (uint)*(byte *)((long)in_RDI + 0x116);
    if (cVar1 == -0x3a) {
      if (uVar3 == 200) {
        local_34 = 1;
      }
      else {
        local_34 = 0;
        if (uVar3 == 0xb7) {
          local_34 = 2;
        }
      }
      local_28 = local_34;
    }
    else if (cVar1 == -0x38) {
      if (uVar3 == 0xc6) {
        local_38 = 1;
      }
      else {
        local_38 = 0;
        if (uVar3 == 0xb7) {
          local_38 = 3;
        }
      }
      local_28 = local_38;
    }
    else if (cVar1 == -0x49) {
      if (uVar3 == 0xc6) {
        local_3c = 2;
      }
      else {
        local_3c = 0;
        if (uVar3 == 200) {
          local_3c = 3;
        }
      }
      local_28 = local_3c;
    }
    else {
      local_28 = 0;
    }
    if (local_28 != 0) {
      if (local_28 == 1) {
        for (local_c = 0x29; local_c < 0x2b; local_c = local_c + 1) {
          uVar3 = (uint)*(byte *)((long)in_RDI + (long)local_c + 0x104);
          if ((uVar3 != 0) && (iVar6 = GetCol(uVar3), iVar6 == 7)) {
            iVar5 = GetRow(uVar3);
            if ((*(ushort *)
                  ((long)(iVar5 + -3) * 0x2000 + 0x339d82 +
                  (ulong)*(ushort *)((long)in_RDI + (long)iVar6 * 2 + 0x154) * 8) & 1) == 0) {
              if (((*(ushort *)
                     ((long)(iVar5 + -3) * 0x2000 + 0x339d86 +
                     (ulong)*(ushort *)((long)in_RDI + (long)iVar6 * 2 + 0x154) * 8) & 1) != 0) &&
                 ((*(char *)((long)in_RDI + 0xbb) == '\x15' ||
                  (*(char *)((long)in_RDI + 0xbb) == '\x16')))) {
                local_2c = CentralThreat[0xf - iVar5] + local_2c;
              }
            }
            else {
              local_2c = HollowThreat[0xf - iVar5] + local_2c;
            }
          }
        }
      }
      else if (local_28 - 2U < 2) {
        for (local_c = 0x29; local_c < 0x2b; local_c = local_c + 1) {
          uVar4 = (uint)*(byte *)((long)in_RDI + (long)local_c + 0x104);
          if (uVar4 != 0) {
            iVar6 = GetCol(uVar4);
            iVar5 = GetRow(uVar4);
            if (iVar6 == 7) {
              if ((*(ushort *)
                    ((long)(iVar5 + -3) * 0x2000 + 0x339d86 +
                    (ulong)*(ushort *)((long)in_RDI + 0x162) * 8) & 1) != 0) {
                iVar6 = CentralThreat[0xf - iVar5];
                bVar2 = IfProtected(in_stack_fffffffffffffff0,uVar4,(Situation *)CONCAT44(uVar3,7),
                                    iVar5);
                iVar5 = 0;
                if (bVar2) {
                  iVar5 = 0x14;
                }
                local_2c = (iVar6 >> 2) + iVar5 + local_2c;
                for (in_stack_fffffffffffffff0 = 0x17; in_stack_fffffffffffffff0 < 0x19;
                    in_stack_fffffffffffffff0 = in_stack_fffffffffffffff0 + 1) {
                  uVar4 = (uint)*(byte *)((long)in_RDI + (long)in_stack_fffffffffffffff0 + 0x104);
                  if (uVar4 != 0) {
                    iVar6 = GetCol(uVar4);
                    iVar5 = GetRow(uVar4);
                    if ((iVar5 == 0xc) &&
                       ((*(ushort *)
                          ((long)(iVar6 + -3) * 0x1000 + 0x330d82 +
                          (ulong)*(ushort *)(in_RDI + 0x53) * 8) & 0x10) != 0)) {
                      local_2c = local_2c + 0x50;
                    }
                  }
                }
              }
            }
            else if ((iVar5 == 0xc) &&
                    ((*(ushort *)
                       ((long)(iVar6 + -3) * 0x1000 + 0x330d82 +
                       (ulong)*(ushort *)(in_RDI + 0x53) * 8) & 0x10) != 0)) {
              local_2c = RedBottomThreat[iVar6] + local_2c;
            }
          }
        }
      }
    }
  }
  else if ((char)in_RDI[0x45] == -0x49) {
    local_2c = 0x14;
  }
  if ((*(char *)((long)in_RDI + 0x125) == '\0') || (*(char *)((long)in_RDI + 0x126) == '\0')) {
    if ((*(char *)((long)in_RDI + 0x11b) != '\0') && ((char)in_RDI[0x47] != '\0')) {
      local_30 = BlackAdvisorLeakage;
    }
  }
  else if ((char)in_RDI[0x49] == '7') {
    cVar1 = *(char *)((long)in_RDI + 0x125);
    uVar3 = (uint)*(byte *)((long)in_RDI + 0x126);
    if (cVar1 == '6') {
      if (uVar3 == 0x38) {
        local_48 = 1;
      }
      else {
        local_48 = 0;
        if (uVar3 == 0x47) {
          local_48 = 2;
        }
      }
      local_28 = local_48;
    }
    else if (cVar1 == '8') {
      if (uVar3 == 0x36) {
        local_4c = 1;
      }
      else {
        local_4c = 0;
        if (uVar3 == 0x47) {
          local_4c = 3;
        }
      }
      local_28 = local_4c;
    }
    else if (cVar1 == 'G') {
      if (uVar3 == 0x36) {
        local_50 = 2;
      }
      else {
        local_50 = 0;
        if (uVar3 == 0x38) {
          local_50 = 3;
        }
      }
      local_28 = local_50;
    }
    else {
      local_28 = 0;
    }
    if (local_28 != 0) {
      if (local_28 == 1) {
        for (local_c = 0x19; local_c < 0x1b; local_c = local_c + 1) {
          uVar3 = (uint)*(byte *)((long)in_RDI + (long)local_c + 0x104);
          if ((uVar3 != 0) && (iVar6 = GetCol(uVar3), iVar6 == 7)) {
            iVar5 = GetRow(uVar3);
            if ((*(ushort *)
                  ((long)(iVar5 + -3) * 0x2000 + 0x339d82 +
                  (ulong)*(ushort *)((long)in_RDI + (long)iVar6 * 2 + 0x154) * 8) & 0x200) == 0) {
              if (((*(ushort *)
                     ((long)(iVar5 + -3) * 0x2000 + 0x339d86 +
                     (ulong)*(ushort *)((long)in_RDI + (long)iVar6 * 2 + 0x154) * 8) & 0x200) != 0)
                 && ((*(char *)((long)in_RDI + 0x4b) == '%' ||
                     (*(char *)((long)in_RDI + 0x4b) == '&')))) {
                local_30 = CentralThreat[iVar5] + local_30;
              }
            }
            else {
              local_30 = HollowThreat[iVar5] + local_30;
            }
          }
        }
      }
      else if (local_28 - 2U < 2) {
        for (local_c = 0x19; local_c < 0x1b; local_c = local_c + 1) {
          uVar4 = (uint)*(byte *)((long)in_RDI + (long)local_c + 0x104);
          if (uVar4 != 0) {
            iVar6 = GetCol(uVar4);
            iVar5 = GetRow(uVar4);
            if (iVar6 == 7) {
              if ((*(ushort *)
                    ((long)(iVar5 + -3) * 0x2000 + 0x339d86 +
                    (ulong)*(ushort *)((long)in_RDI + 0x162) * 8) & 0x200) != 0) {
                iVar6 = CentralThreat[iVar5];
                bVar2 = IfProtected(in_stack_fffffffffffffff0,uVar4,(Situation *)CONCAT44(uVar3,7),
                                    iVar5);
                iVar5 = 0;
                if (bVar2) {
                  iVar5 = 0x14;
                }
                local_30 = (iVar6 >> 2) + iVar5 + local_30;
                for (in_stack_fffffffffffffff0 = 0x27; in_stack_fffffffffffffff0 < 0x29;
                    in_stack_fffffffffffffff0 = in_stack_fffffffffffffff0 + 1) {
                  uVar4 = (uint)*(byte *)((long)in_RDI + (long)in_stack_fffffffffffffff0 + 0x104);
                  if (uVar4 != 0) {
                    iVar6 = GetCol(uVar4);
                    iVar5 = GetRow(uVar4);
                    if ((iVar5 == 3) &&
                       ((*(ushort *)
                          ((long)(iVar6 + -3) * 0x1000 + 0x330d82 +
                          (ulong)*(ushort *)((long)in_RDI + 0x13a) * 8) & 0x10) != 0)) {
                      local_30 = local_30 + 0x50;
                    }
                  }
                }
              }
            }
            else if ((iVar5 == 3) &&
                    ((*(ushort *)
                       ((long)(iVar6 + -3) * 0x1000 + 0x330d82 +
                       (ulong)*(ushort *)((long)in_RDI + 0x13a) * 8) & 0x10) != 0)) {
              local_30 = BlackBottomThreat[iVar6] + local_30;
            }
          }
        }
      }
    }
  }
  else if ((char)in_RDI[0x49] == 'G') {
    local_30 = 0x14;
  }
  iVar6 = SideValue(*in_RDI,local_30 - local_2c);
  return iVar6;
}

Assistant:

int AdvisorShape(Situation &s)
{
    int pc_cannon, pc_rook, pos, adv1, adv2, x, y, shape;
    int red_penalty_value, black_penalty_value;
    red_penalty_value = black_penalty_value = 0;

    //红方
    if (s.current_pieces[16 + 1] && s.current_pieces[16 + 2]) //双士健在
    {
        if (s.current_pieces[16] == 0xc7)
        {
            adv1 = s.current_pieces[16 + 1];
            adv2 = s.current_pieces[16 + 2];
            if (adv1 == 0xc6) // 红方一个仕在左侧底线
                shape = ((adv2 == 0xc8) ? SHAPE_CENTER : ((adv2 == 0xb7) ? SHAPE_LEFT : SHAPE_NONE));
            else if (adv1 == 0xc8) // 红方一个仕在右侧底线
                shape = ((adv2 == 0xc6) ? SHAPE_CENTER : ((adv2 == 0xb7) ? SHAPE_RIGHT : SHAPE_NONE));
            else if (adv1 == 0xb7) // 红方一个仕在花心
                shape = ((adv2 == 0xc6) ? SHAPE_LEFT : ((adv2 == 0xc8) ? SHAPE_RIGHT : SHAPE_NONE));
            else
                shape = SHAPE_NONE;

            switch (shape)
            {
            case SHAPE_NONE:
                break;
            case SHAPE_CENTER:
                for (pc_cannon = 32 + 9; pc_cannon <= 32 + 10; pc_cannon++)
                {
                    pos = s.current_pieces[pc_cannon];
                    if (pos)
                    {
                        x = GetCol(pos);
                        if (x == FILE_CENTER)
                        {
                            y = GetRow(pos);
                            if ((ROOK_CANNON_CAN_GET_COL_MASK[y - 3][s.bit_col[x]].rook_capture & 1) != 0) // 计算空头炮的威胁
                                red_penalty_value += HollowThreat[15 - y];
                            else if (((ROOK_CANNON_CAN_GET_COL_MASK[y - 3][s.bit_col[x]].supercannon_capture & 1) != 0) && (s.current_board[0xb7] == 21 || s.current_board[0xb7] == 22)) // 计算炮镇窝心马的威胁
                                red_penalty_value += CentralThreat[15 - y];
                        }
                    }
                }
                break;
            case SHAPE_LEFT:
            case SHAPE_RIGHT:
                for (pc_cannon = 32 + 9; pc_cannon <= 32 + 10; pc_cannon++)
                {
                    pos = s.current_pieces[pc_cannon];
                    if (pos)
                    {
                        x = GetCol(pos);
                        y = GetRow(pos);
                        if (x == FILE_CENTER)
                        {
                            if ((ROOK_CANNON_CAN_GET_COL_MASK[y - 3][s.bit_col[x]].supercannon_capture & 1) != 0)
                            {
                                // 计算一般中炮的威胁，帅(将)门被对方控制的还有额外罚分
                                red_penalty_value += ((CentralThreat[15 - y] >> 2) +
                                                        (IfProtected(1, shape == SHAPE_LEFT ? 0xc8 : 0xc6, s) ? 20 : 0));
                                // 如果车在底线保护帅(将)，则给予更大的罚分
                                for (pc_rook = 16 + 7; pc_rook <= 16 + 8; pc_rook++)
                                {
                                    pos = s.current_pieces[pc_rook];
                                    if (pos)
                                    {
                                        x = GetCol(pos);
                                        y = GetRow(pos);
                                        if (y == RANK_BOTTOM)
                                        {
                                            if ((ROOK_CANNON_CAN_GET_ROW_MASK[x - 3][s.bit_row[y]].rook_capture & 16) != 0)
                                                red_penalty_value += 80;
                                        }
                                    }
                                }
                            }
                        }
                        else if (y == RANK_BOTTOM) // 计算沉底炮的威胁
                        {
                            if ((ROOK_CANNON_CAN_GET_ROW_MASK[x - 3][s.bit_row[y]].rook_capture & 16) != 0)
                                red_penalty_value += RedBottomThreat[x];
                        }
                    }
                }
                break;
            default:
                break;
            }
        }
        else if (s.current_pieces[16] == 0xb7) // 有双仕(士)但花心被帅(将)占领，要罚分
            red_penalty_value += 20;
    }
    else
    {
        if (s.current_pieces[32 + 7] && s.current_pieces[32 + 8]) // 缺仕(士)怕双车，有罚分
            red_penalty_value += RedAdvisorLeakage;
    }

    //黑方
    if (s.current_pieces[32 + 1] && s.current_pieces[32 + 2]) //双士健在
    {
        if (s.current_pieces[32] == 0x37)
        {
            adv1 = s.current_pieces[32 + 1];
            adv2 = s.current_pieces[32 + 2];
            if (adv1 == 0x36) // 黑方一个仕在左侧底线
                shape = ((adv2 == 0x38) ? SHAPE_CENTER : ((adv2 == 0x47) ? SHAPE_LEFT : SHAPE_NONE));
            else if (adv1 == 0x38) // 黑方一个仕在右侧底线
                shape = ((adv2 == 0x36) ? SHAPE_CENTER : ((adv2 == 0x47) ? SHAPE_RIGHT : SHAPE_NONE));
            else if (adv1 == 0x47) // 黑方一个仕在花心
                shape = ((adv2 == 0x36) ? SHAPE_LEFT : ((adv2 == 0x38) ? SHAPE_RIGHT : SHAPE_NONE));
            else
                shape = SHAPE_NONE;

            switch (shape)
            {
            case SHAPE_NONE:
                break;
            case SHAPE_CENTER:
                for (pc_cannon = 16 + 9; pc_cannon <= 16 + 10; pc_cannon++)
                {
                    pos = s.current_pieces[pc_cannon];
                    if (pos)
                    {
                        x = GetCol(pos);
                        if (x == FILE_CENTER)
                        {
                            y = GetRow(pos);
                            if ((ROOK_CANNON_CAN_GET_COL_MASK[y - 3][s.bit_col[x]].rook_capture & 512) != 0) // 计算空头炮的威胁
                                black_penalty_value += HollowThreat[y];
                            else if (((ROOK_CANNON_CAN_GET_COL_MASK[y - 3][s.bit_col[x]].supercannon_capture & 512) != 0) && (s.current_board[0x47] == 37 || s.current_board[0x47] == 38)) // 计算炮镇窝心马的威胁
                                black_penalty_value += CentralThreat[y];
                        }
                    }
                }
                break;
            case SHAPE_LEFT:
            case SHAPE_RIGHT:
                for (pc_cannon = 16 + 9; pc_cannon <= 16 + 10; pc_cannon++)
                {
                    pos = s.current_pieces[pc_cannon];
                    if (pos)
                    {
                        x = GetCol(pos);
                        y = GetRow(pos);
                        if (x == FILE_CENTER)
                        {
                            if ((ROOK_CANNON_CAN_GET_COL_MASK[y - 3][s.bit_col[x]].supercannon_capture & 512) != 0)
                            {
                                // 计算一般中炮的威胁，帅(将)门被对方控制的还有额外罚分
                                black_penalty_value += ((CentralThreat[y] >> 2) +
                                                        (IfProtected(0, shape == SHAPE_LEFT ? 0x38 : 0x36, s) ? 20 : 0));
                                // 如果车在底线保护帅(将)，则给予更大的罚分
                                for (pc_rook = 32 + 7; pc_rook <= 32 + 8; pc_rook++)
                                {
                                    pos = s.current_pieces[pc_rook];
                                    if (pos)
                                    {
                                        x = GetCol(pos);
                                        y = GetRow(pos);
                                        if (y == RANK_TOP)
                                        {
                                            if ((ROOK_CANNON_CAN_GET_ROW_MASK[x - 3][s.bit_row[y]].rook_capture & 16) != 0)
                                                black_penalty_value += 80;
                                        }
                                    }
                                }
                            }
                        }
                        else if (y == RANK_TOP) // 计算沉底炮的威胁
                        {
                            if ((ROOK_CANNON_CAN_GET_ROW_MASK[x - 3][s.bit_row[y]].rook_capture & 16) != 0)
                                black_penalty_value += BlackBottomThreat[x];
                        }
                    }
                }
                break;
            default:
                break;
            }
        }
        else if (s.current_pieces[32] == 0x47) // 有双仕(士)但花心被帅(将)占领，要罚分
            black_penalty_value += 20;
    }
    else
    {
        if (s.current_pieces[16 + 7] && s.current_pieces[16 + 8]) // 缺仕(士)怕双车，有罚分
            black_penalty_value += BlackAdvisorLeakage;
    }

    return SideValue(s.current_player, black_penalty_value - red_penalty_value);
}